

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_storage.cpp
# Opt level: O0

void __thiscall duckdb::DataPointer::Serialize(DataPointer *this,Serializer *serializer)

{
  char *in_RSI;
  BaseStatistics *in_RDI;
  Serializer *unaff_retaddr;
  BaseStatistics *pBVar1;
  field_id_t field_id;
  
  pBVar1 = in_RDI;
  Serializer::WritePropertyWithDefault<unsigned_long>
            (unaff_retaddr,(field_id_t)((ulong)in_RDI >> 0x30),in_RSI,(unsigned_long *)in_RDI);
  field_id = (field_id_t)((ulong)pBVar1 >> 0x30);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (unaff_retaddr,field_id,in_RSI,(unsigned_long *)in_RDI);
  Serializer::WriteProperty<duckdb::BlockPointer>
            (unaff_retaddr,field_id,in_RSI,(BlockPointer *)in_RDI);
  Serializer::WriteProperty<duckdb::CompressionType>
            (unaff_retaddr,field_id,in_RSI,(CompressionType *)in_RDI);
  Serializer::WriteProperty<duckdb::BaseStatistics>(unaff_retaddr,field_id,in_RSI,in_RDI);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::ColumnSegmentState,std::default_delete<duckdb::ColumnSegmentState>,true>>
            (unaff_retaddr,field_id,in_RSI,
             (unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>,_true>
              *)in_RDI);
  return;
}

Assistant:

void DataPointer::Serialize(Serializer &serializer) const {
	serializer.WritePropertyWithDefault<uint64_t>(100, "row_start", row_start);
	serializer.WritePropertyWithDefault<uint64_t>(101, "tuple_count", tuple_count);
	serializer.WriteProperty<BlockPointer>(102, "block_pointer", block_pointer);
	serializer.WriteProperty<CompressionType>(103, "compression_type", compression_type);
	serializer.WriteProperty<BaseStatistics>(104, "statistics", statistics);
	serializer.WritePropertyWithDefault<unique_ptr<ColumnSegmentState>>(105, "segment_state", segment_state);
}